

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 fts5GetRowidLimit(sqlite3_value *pVal,i64 iDefault)

{
  int iVar1;
  i64 iVar2;
  
  if (pVal != (sqlite3_value *)0x0) {
    iVar1 = sqlite3_value_numeric_type(pVal);
    if (iVar1 == 1) {
      iVar2 = sqlite3VdbeIntValue(pVal);
      return iVar2;
    }
  }
  return iDefault;
}

Assistant:

static i64 fts5GetRowidLimit(sqlite3_value *pVal, i64 iDefault){
  if( pVal ){
    int eType = sqlite3_value_numeric_type(pVal);
    if( eType==SQLITE_INTEGER ){
      return sqlite3_value_int64(pVal);
    }
  }
  return iDefault;
}